

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O0

void __thiscall
icu_63::RegexCompile::compile(RegexCompile *this,UText *pat,UParseError *pp,UErrorCode *e)

{
  undefined1 auVar1 [16];
  UBool UVar2;
  int32_t iVar3;
  UText *pUVar4;
  int64_t iVar5;
  UnicodeSet *this_00;
  ulong uVar6;
  UMemory *this_01;
  Regex8BitSet *pRVar7;
  EVP_PKEY_CTX *ctx;
  RegexPatternChar *c;
  size_t size;
  Regex8BitSet *local_a8;
  Regex8BitSet *local_88;
  UnicodeSet *s;
  int32_t i;
  uint *puStack_38;
  int32_t numSets;
  RegexTableEl *tableEl;
  uint16_t state;
  UErrorCode *e_local;
  UParseError *pp_local;
  UText *pat_local;
  RegexCompile *this_local;
  
  this->fStatus = e;
  this->fParseErr = pp;
  this->fStackPtr = 0;
  this->fStack[this->fStackPtr] = 0;
  UVar2 = ::U_FAILURE(*this->fStatus);
  if (UVar2 == '\0') {
    pUVar4 = utext_clone_63(this->fRXPat->fPattern,pat,'\0','\x01',this->fStatus);
    this->fRXPat->fPattern = pUVar4;
    UVar2 = ::U_FAILURE(*this->fStatus);
    if (UVar2 == '\0') {
      this->fRXPat->fStaticSets = RegexStaticSets::gStaticSets;
      this->fRXPat->fStaticSets8 = (Regex8BitSet *)(RegexStaticSets::gStaticSets + 0xd);
      iVar5 = utext_nativeLength_63(pat);
      this->fPatternLength = iVar5;
      tableEl._6_2_ = 1;
      if ((this->fModeFlags & 0x10U) != 0) {
        this->fQuoteMode = '\x01';
      }
      c = &this->fC;
      nextChar(this,c);
      while (UVar2 = ::U_FAILURE(*this->fStatus), UVar2 == '\0') {
        puStack_38 = (uint *)(gRuleParseStateTable + (ulong)tableEl._6_2_ * 8);
        while ((((((0x7e < (byte)puStack_38[1] || ((this->fC).fQuoted != '\0')) ||
                  ((uint)(byte)puStack_38[1] != (this->fC).fChar)) && ((char)puStack_38[1] != -1))
                && ((((char)puStack_38[1] != -2 || ((this->fC).fQuoted == '\0')) &&
                    (((char)puStack_38[1] != -3 || ((this->fC).fChar != -1)))))) &&
               ((((byte)puStack_38[1] < 0x80 || (0xef < (byte)puStack_38[1])) ||
                (((this->fC).fQuoted != '\0' ||
                 (((this->fC).fChar == -1 ||
                  (UVar2 = UnicodeSet::contains
                                     ((UnicodeSet *)
                                      (RegexStaticSets::gStaticSets +
                                      (long)(int)((byte)puStack_38[1] - 0x80) * 0xb + 0x41),
                                      (this->fC).fChar), UVar2 == '\0'))))))))) {
          puStack_38 = puStack_38 + 2;
        }
        c = (RegexPatternChar *)(ulong)*puStack_38;
        UVar2 = doParseActions(this,*puStack_38);
        if (UVar2 == '\0') break;
        if (*(char *)((long)puStack_38 + 6) != '\0') {
          this->fStackPtr = this->fStackPtr + 1;
          if (99 < this->fStackPtr) {
            c = (RegexPatternChar *)0x10300;
            error(this,U_REGEX_ERROR_START);
            this->fStackPtr = this->fStackPtr + -1;
          }
          this->fStack[this->fStackPtr] = (ushort)*(byte *)((long)puStack_38 + 6);
        }
        if (*(char *)((long)puStack_38 + 7) != '\0') {
          c = &this->fC;
          nextChar(this,c);
        }
        if (*(char *)((long)puStack_38 + 5) == -1) {
          tableEl._6_2_ = this->fStack[this->fStackPtr];
          this->fStackPtr = this->fStackPtr + -1;
          if (this->fStackPtr < 0) {
            this->fStackPtr = this->fStackPtr + 1;
            c = (RegexPatternChar *)0x10306;
            error(this,U_REGEX_MISMATCHED_PAREN);
          }
        }
        else {
          tableEl._6_2_ = (uint16_t)*(byte *)((long)puStack_38 + 5);
        }
      }
      UVar2 = ::U_FAILURE(*this->fStatus);
      if (UVar2 == '\0') {
        allocateStackData(this,2);
        stripNOPs(this);
        iVar3 = UVector64::size(this->fRXPat->fCompiledPat);
        size = 3;
        iVar3 = minMatchLength(this,3,iVar3 + -1);
        this->fRXPat->fMinMatchLen = iVar3;
        matchStartType(this);
        iVar3 = UVector::size(this->fRXPat->fSets);
        uVar6 = (ulong)iVar3;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar6;
        this_01 = SUB168(auVar1 * ZEXT816(0x20),0);
        if (SUB168(auVar1 * ZEXT816(0x20),8) != 0) {
          this_01 = (UMemory *)0xffffffffffffffff;
        }
        pRVar7 = (Regex8BitSet *)UMemory::operator_new__(this_01,size);
        local_88 = (Regex8BitSet *)0x0;
        if ((pRVar7 != (Regex8BitSet *)0x0) && (local_88 = pRVar7, uVar6 != 0)) {
          local_a8 = pRVar7;
          do {
            Regex8BitSet::Regex8BitSet(local_a8);
            local_a8 = local_a8 + 1;
          } while (local_a8 != pRVar7 + uVar6);
        }
        this->fRXPat->fSets8 = local_88;
        if (this->fRXPat->fSets8 == (Regex8BitSet *)0x0) {
          *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
          *e = U_MEMORY_ALLOCATION_ERROR;
        }
        else {
          for (s._0_4_ = 0; (int)s < iVar3; s._0_4_ = (int)s + 1) {
            ctx = (EVP_PKEY_CTX *)UVector::elementAt(this->fRXPat->fSets,(int)s);
            Regex8BitSet::init(this->fRXPat->fSets8 + (int)s,ctx);
          }
        }
      }
      else {
        while (UVar2 = UStack::empty(&this->fSetStack), UVar2 == '\0') {
          this_00 = (UnicodeSet *)UStack::pop(&this->fSetStack);
          if (this_00 != (UnicodeSet *)0x0) {
            UnicodeSet::~UnicodeSet(this_00);
            UMemory::operator_delete((UMemory *)this_00,c);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void    RegexCompile::compile(
                         UText *pat,                 // Source pat to be compiled.
                         UParseError &pp,            // Error position info
                         UErrorCode &e)              // Error Code
{
    fStatus             = &e;
    fParseErr           = &pp;
    fStackPtr           = 0;
    fStack[fStackPtr]   = 0;

    if (U_FAILURE(*fStatus)) {
        return;
    }

    // There should be no pattern stuff in the RegexPattern object.  They can not be reused.
    U_ASSERT(fRXPat->fPattern == NULL || utext_nativeLength(fRXPat->fPattern) == 0);

    // Prepare the RegexPattern object to receive the compiled pattern.
    fRXPat->fPattern        = utext_clone(fRXPat->fPattern, pat, FALSE, TRUE, fStatus);
    if (U_FAILURE(*fStatus)) {
        return;
    }
    fRXPat->fStaticSets     = RegexStaticSets::gStaticSets->fPropSets;
    fRXPat->fStaticSets8    = RegexStaticSets::gStaticSets->fPropSets8;


    // Initialize the pattern scanning state machine
    fPatternLength = utext_nativeLength(pat);
    uint16_t                state = 1;
    const RegexTableEl      *tableEl;

    // UREGEX_LITERAL force entire pattern to be treated as a literal string.
    if (fModeFlags & UREGEX_LITERAL) {
        fQuoteMode = TRUE;
    }

    nextChar(fC);                        // Fetch the first char from the pattern string.

    //
    // Main loop for the regex pattern parsing state machine.
    //   Runs once per state transition.
    //   Each time through optionally performs, depending on the state table,
    //      - an advance to the the next pattern char
    //      - an action to be performed.
    //      - pushing or popping a state to/from the local state return stack.
    //   file regexcst.txt is the source for the state table.  The logic behind
    //     recongizing the pattern syntax is there, not here.
    //
    for (;;) {
        //  Bail out if anything has gone wrong.
        //  Regex pattern parsing stops on the first error encountered.
        if (U_FAILURE(*fStatus)) {
            break;
        }

        U_ASSERT(state != 0);

        // Find the state table element that matches the input char from the pattern, or the
        //    class of the input character.  Start with the first table row for this
        //    state, then linearly scan forward until we find a row that matches the
        //    character.  The last row for each state always matches all characters, so
        //    the search will stop there, if not before.
        //
        tableEl = &gRuleParseStateTable[state];
        REGEX_SCAN_DEBUG_PRINTF(("char, line, col = (\'%c\', %d, %d)    state=%s ",
            fC.fChar, fLineNum, fCharNum, RegexStateNames[state]));

        for (;;) {    // loop through table rows belonging to this state, looking for one
                      //   that matches the current input char.
            REGEX_SCAN_DEBUG_PRINTF(("."));
            if (tableEl->fCharClass < 127 && fC.fQuoted == FALSE &&   tableEl->fCharClass == fC.fChar) {
                // Table row specified an individual character, not a set, and
                //   the input character is not quoted, and
                //   the input character matched it.
                break;
            }
            if (tableEl->fCharClass == 255) {
                // Table row specified default, match anything character class.
                break;
            }
            if (tableEl->fCharClass == 254 && fC.fQuoted)  {
                // Table row specified "quoted" and the char was quoted.
                break;
            }
            if (tableEl->fCharClass == 253 && fC.fChar == (UChar32)-1)  {
                // Table row specified eof and we hit eof on the input.
                break;
            }

            if (tableEl->fCharClass >= 128 && tableEl->fCharClass < 240 &&   // Table specs a char class &&
                fC.fQuoted == FALSE &&                                       //   char is not escaped &&
                fC.fChar != (UChar32)-1) {                                   //   char is not EOF
                U_ASSERT(tableEl->fCharClass <= 137);
                if (RegexStaticSets::gStaticSets->fRuleSets[tableEl->fCharClass-128].contains(fC.fChar)) {
                    // Table row specified a character class, or set of characters,
                    //   and the current char matches it.
                    break;
                }
            }

            // No match on this row, advance to the next  row for this state,
            tableEl++;
        }
        REGEX_SCAN_DEBUG_PRINTF(("\n"));

        //
        // We've found the row of the state table that matches the current input
        //   character from the rules string.
        // Perform any action specified  by this row in the state table.
        if (doParseActions(tableEl->fAction) == FALSE) {
            // Break out of the state machine loop if the
            //   the action signalled some kind of error, or
            //   the action was to exit, occurs on normal end-of-rules-input.
            break;
        }

        if (tableEl->fPushState != 0) {
            fStackPtr++;
            if (fStackPtr >= kStackSize) {
                error(U_REGEX_INTERNAL_ERROR);
                REGEX_SCAN_DEBUG_PRINTF(("RegexCompile::parse() - state stack overflow.\n"));
                fStackPtr--;
            }
            fStack[fStackPtr] = tableEl->fPushState;
        }

        //
        //  NextChar.  This is where characters are actually fetched from the pattern.
        //             Happens under control of the 'n' tag in the state table.
        //
        if (tableEl->fNextChar) {
            nextChar(fC);
        }

        // Get the next state from the table entry, or from the
        //   state stack if the next state was specified as "pop".
        if (tableEl->fNextState != 255) {
            state = tableEl->fNextState;
        } else {
            state = fStack[fStackPtr];
            fStackPtr--;
            if (fStackPtr < 0) {
                // state stack underflow
                // This will occur if the user pattern has mis-matched parentheses,
                //   with extra close parens.
                //
                fStackPtr++;
                error(U_REGEX_MISMATCHED_PAREN);
            }
        }

    }

    if (U_FAILURE(*fStatus)) {
        // Bail out if the pattern had errors.
        //   Set stack cleanup:  a successful compile would have left it empty,
        //   but errors can leave temporary sets hanging around.
        while (!fSetStack.empty()) {
            delete (UnicodeSet *)fSetStack.pop();
        }
        return;
    }

    //
    // The pattern has now been read and processed, and the compiled code generated.
    //

    //
    // The pattern's fFrameSize so far has accumulated the requirements for
    //   storage for capture parentheses, counters, etc. that are encountered
    //   in the pattern.  Add space for the two variables that are always
    //   present in the saved state:  the input string position (int64_t) and
    //   the position in the compiled pattern.
    //
    allocateStackData(RESTACKFRAME_HDRCOUNT);

    //
    // Optimization pass 1: NOPs, back-references, and case-folding
    //
    stripNOPs();

    //
    // Get bounds for the minimum and maximum length of a string that this
    //   pattern can match.  Used to avoid looking for matches in strings that
    //   are too short.
    //
    fRXPat->fMinMatchLen = minMatchLength(3, fRXPat->fCompiledPat->size()-1);

    //
    // Optimization pass 2: match start type
    //
    matchStartType();

    //
    // Set up fast latin-1 range sets
    //
    int32_t numSets = fRXPat->fSets->size();
    fRXPat->fSets8 = new Regex8BitSet[numSets];
    // Null pointer check.
    if (fRXPat->fSets8 == NULL) {
        e = *fStatus = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    int32_t i;
    for (i=0; i<numSets; i++) {
        UnicodeSet *s = (UnicodeSet *)fRXPat->fSets->elementAt(i);
        fRXPat->fSets8[i].init(s);
    }

}